

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

int CheckInventory(AActor *activator,char *type,bool max)

{
  bool bVar1;
  int iVar2;
  PClassActor *type_00;
  AInventory *pAVar3;
  AActor *pAVar4;
  int local_3c;
  AInventory *item;
  PClassActor *info;
  char *pcStack_20;
  bool max_local;
  char *type_local;
  AActor *activator_local;
  
  if ((activator == (AActor *)0x0) || (type == (char *)0x0)) {
    activator_local._4_4_ = 0;
  }
  else {
    iVar2 = strcasecmp(type,"Armor");
    if (iVar2 == 0) {
      pcStack_20 = "BasicArmor";
    }
    else {
      iVar2 = strcasecmp(type,"Health");
      pcStack_20 = type;
      if (iVar2 == 0) {
        if (!max) {
          return activator->health;
        }
        bVar1 = DObject::IsKindOf((DObject *)activator,APlayerPawn::RegistrationInfo.MyClass);
        if (!bVar1) {
          iVar2 = AActor::SpawnHealth(activator);
          return iVar2;
        }
        return *(int *)&activator[1].super_DThinker.super_DObject._vptr_DObject;
      }
    }
    type_00 = PClass::FindActor(pcStack_20);
    if (type_00 == (PClassActor *)0x0) {
      DPrintf(1,"ACS: \'%s\': Unknown actor class.\n",pcStack_20);
      activator_local._4_4_ = 0;
    }
    else {
      bVar1 = PClass::IsDescendantOf(&type_00->super_PClass,AInventory::RegistrationInfo.MyClass);
      if (bVar1) {
        pAVar3 = AActor::FindInventory(activator,type_00,false);
        if (max) {
          if (pAVar3 != (AInventory *)0x0) {
            return pAVar3->MaxAmount;
          }
          if ((type_00 != (PClassActor *)0x0) &&
             (bVar1 = PClass::IsDescendantOf
                                (&type_00->super_PClass,AInventory::RegistrationInfo.MyClass), bVar1
             )) {
            pAVar4 = GetDefaultByType(&type_00->super_PClass);
            return *(int *)((long)&pAVar4[1].super_DThinker.super_DObject.Class + 4);
          }
        }
        if (pAVar3 == (AInventory *)0x0) {
          local_3c = 0;
        }
        else {
          local_3c = pAVar3->Amount;
        }
        activator_local._4_4_ = local_3c;
      }
      else {
        DPrintf(1,"ACS: \'%s\' is not an inventory item.\n",pcStack_20);
        activator_local._4_4_ = 0;
      }
    }
  }
  return activator_local._4_4_;
}

Assistant:

static int CheckInventory (AActor *activator, const char *type, bool max)
{
	if (activator == NULL || type == NULL)
		return 0;

	if (stricmp (type, "Armor") == 0)
	{
		type = "BasicArmor";
	}
	else if (stricmp (type, "Health") == 0)
	{
		if (max)
		{
			if (activator->IsKindOf (RUNTIME_CLASS (APlayerPawn)))
				return static_cast<APlayerPawn *>(activator)->MaxHealth;
			else
				return activator->SpawnHealth();
		}
		return activator->health;
	}

	PClassActor *info = PClass::FindActor (type);

	if (info == NULL)
	{
		DPrintf (DMSG_ERROR, "ACS: '%s': Unknown actor class.\n", type);
		return 0;
	}
	else if (!info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
	{
		DPrintf(DMSG_ERROR, "ACS: '%s' is not an inventory item.\n", type);
		return 0;
	}

	AInventory *item = activator->FindInventory (info);

	if (max)
	{
		if (item)
		{
			return item->MaxAmount;
		}
		else if (info != nullptr && info->IsDescendantOf(RUNTIME_CLASS(AInventory)))
		{
			return ((AInventory *)GetDefaultByType(info))->MaxAmount;
		}
	}
	return item ? item->Amount : 0;
}